

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_search_facade.c
# Opt level: O2

void do_masked_motion_search_indexed
               (AV1_COMP *cpi,MACROBLOCK *x,int_mv *cur_mv,INTERINTER_COMPOUND_DATA *comp_data,
               BLOCK_SIZE bsize,int_mv *tmp_mv,int *rate_mv,int which)

{
  buf_2d *pbVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int other_w;
  int other_h;
  uint uVar6;
  MB_MODE_INFO *pMVar7;
  undefined8 uVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  int iVar11;
  int iVar12;
  uint8_t *mask;
  ulong uVar13;
  uint uVar14;
  undefined7 in_register_00000081;
  InterpFilterParams *pIVar15;
  uint8_t *dst;
  scale_factors sf;
  InterPredParams local_8110;
  uint8_t local_8038 [32776];
  
  uVar13 = CONCAT71(in_register_00000081,bsize) & 0xffffffff;
  bVar2 = block_size_wide[uVar13];
  mask = av1_get_compound_type_mask(comp_data,(*(x->e_mbd).mi)->bsize);
  *tmp_mv = *cur_mv;
  tmp_mv[1] = cur_mv[1];
  if ((uint)which < 2) {
    dst = (uint8_t *)((ulong)local_8038 >> 1);
    if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
      dst = local_8038;
    }
    uVar14 = which ^ 1;
    bVar3 = block_size_high[uVar13];
    iVar4 = (x->e_mbd).mi_col;
    iVar11 = (x->e_mbd).plane[0].subsampling_x;
    pMVar7 = *(x->e_mbd).mi;
    iVar5 = (x->e_mbd).mi_row;
    iVar12 = (x->e_mbd).plane[0].subsampling_y;
    pbVar1 = (x->e_mbd).plane[0].pre + uVar14;
    puVar9 = pbVar1->buf;
    puVar10 = pbVar1->buf0;
    other_w = (x->e_mbd).plane[0].pre[uVar14].width;
    other_h = (x->e_mbd).plane[0].pre[uVar14].height;
    pbVar1 = (x->e_mbd).plane[0].pre + uVar14;
    uVar8._0_4_ = pbVar1->stride;
    uVar8._4_4_ = *(undefined4 *)&pbVar1->field_0x1c;
    av1_setup_scale_factors_for_frame(&sf,other_w,other_h,(cpi->common).width,(cpi->common).height);
    local_8110.subsampling_x = (x->e_mbd).plane[0].subsampling_x;
    local_8110.subsampling_y = (x->e_mbd).plane[0].subsampling_y;
    local_8110.bit_depth = (x->e_mbd).bd;
    local_8110.use_hbd_buf = (uint)((x->e_mbd).cur_buf)->flags >> 3 & 1;
    uVar6 = (pMVar7->interp_filters).as_int;
    local_8110.block_width = (int)bVar2;
    local_8110.is_intrabc = 0;
    local_8110.mode = TRANSLATION_PRED;
    local_8110.comp_mode = UNIFORM_SINGLE;
    local_8110.top = (0x120U >> ((byte)local_8110.subsampling_y & 0x1f)) * -0x400 + 0x1000;
    local_8110.left = (0x120U >> ((byte)local_8110.subsampling_x & 0x1f)) * -0x400 + 0x1000;
    uVar13 = (ulong)(uVar6 >> 0xc & 0xff0);
    pIVar15 = (InterpFilterParams *)((long)&av1_interp_filter_params_list[0].filter_ptr + uVar13);
    local_8110.interp_filter_params[0] =
         (InterpFilterParams *)((long)&av1_interp_4tap[0].filter_ptr + uVar13);
    if ((char)(uVar6 >> 0x10) == '\x04') {
      local_8110.interp_filter_params[0] = pIVar15;
    }
    if ((0x10003UL >> ((ulong)bsize & 0x3f) & 1) == 0) {
      local_8110.interp_filter_params[0] = pIVar15;
    }
    uVar13 = (ulong)((uVar6 & 0xff) << 4);
    pIVar15 = (InterpFilterParams *)((long)&av1_interp_filter_params_list[0].filter_ptr + uVar13);
    local_8110.interp_filter_params[1] =
         (InterpFilterParams *)((long)&av1_interp_4tap[0].filter_ptr + uVar13);
    if ((char)uVar6 == '\x04') {
      local_8110.interp_filter_params[1] = pIVar15;
    }
    if ((0x20005UL >> ((ulong)bsize & 0x3f) & 1) == 0) {
      local_8110.interp_filter_params[1] = pIVar15;
    }
    local_8110.scale_factors = &sf;
    local_8110.conv_params.round_0 = 3;
    if (10 < local_8110.bit_depth) {
      local_8110.conv_params.round_0 = local_8110.bit_depth + -7;
    }
    local_8110.conv_params.round_1 = 0xb;
    if (10 < local_8110.bit_depth) {
      local_8110.conv_params.round_1 = 0x15 - local_8110.bit_depth;
    }
    local_8110.conv_params.do_average = 0;
    local_8110.conv_params.dst = (CONV_BUF_TYPE *)0x0;
    local_8110.conv_params.dst_stride = 0;
    local_8110.conv_params.plane = 0;
    local_8110.conv_params.is_compound = 0;
    local_8110.conv_params.use_dist_wtd_comp_avg = 0;
    local_8110.block_height = (uint)bVar3;
    local_8110.pix_row = (iVar5 << 2) >> ((byte)iVar12 & 0x1f);
    local_8110.pix_col = (iVar4 << 2) >> ((byte)iVar11 & 0x1f);
    local_8110.ref_frame_buf.buf = puVar9;
    local_8110.ref_frame_buf.buf0 = puVar10;
    local_8110.ref_frame_buf.width = other_w;
    local_8110.ref_frame_buf.height = other_h;
    local_8110.ref_frame_buf._24_8_ = uVar8;
    av1_enc_build_one_inter_predictor(dst,local_8110.block_width,&tmp_mv[uVar14].as_mv,&local_8110);
    av1_compound_single_motion_search
              (cpi,x,bsize,&tmp_mv[(uint)which].as_mv,dst,mask,(uint)bVar2,rate_mv,which);
  }
  else if (which == 2) {
    av1_joint_motion_search
              (cpi,x,bsize,tmp_mv,mask,(uint)bVar2,rate_mv,
               (uint)((cpi->sf).mv_sf.disable_second_mv == 0),
               ((cpi->sf).inter_sf.enable_fast_compound_mode_search != 2) + 1);
  }
  return;
}

Assistant:

static inline void do_masked_motion_search_indexed(
    const AV1_COMP *const cpi, MACROBLOCK *x, const int_mv *const cur_mv,
    const INTERINTER_COMPOUND_DATA *const comp_data, BLOCK_SIZE bsize,
    int_mv *tmp_mv, int *rate_mv, int which) {
  // NOTE: which values: 0 - 0 only, 1 - 1 only, 2 - both
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  BLOCK_SIZE sb_type = mbmi->bsize;
  const uint8_t *mask;
  const int mask_stride = block_size_wide[bsize];

  mask = av1_get_compound_type_mask(comp_data, sb_type);

  tmp_mv[0].as_int = cur_mv[0].as_int;
  tmp_mv[1].as_int = cur_mv[1].as_int;
  if (which == 0 || which == 1) {
    compound_single_motion_search_interinter(cpi, x, bsize, tmp_mv, mask,
                                             mask_stride, rate_mv, which);
  } else if (which == 2) {
    const int joint_me_num_refine_iter =
        cpi->sf.inter_sf.enable_fast_compound_mode_search == 2
            ? REDUCED_JOINT_ME_REFINE_ITER
            : NUM_JOINT_ME_REFINE_ITER;
    av1_joint_motion_search(cpi, x, bsize, tmp_mv, mask, mask_stride, rate_mv,
                            !cpi->sf.mv_sf.disable_second_mv,
                            joint_me_num_refine_iter);
  }
}